

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

void generate_plus(chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat,wchar_t flag)

{
  loc lVar1;
  wchar_t wVar2;
  wchar_t y1_00;
  wchar_t x1_00;
  
  y1_00 = (y2 + y1) / 2;
  x1_00 = (x2 + x1) / 2;
  wVar2 = y1;
  if (c == (chunk *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                  ,0x183,"void generate_plus(struct chunk *, int, int, int, int, int, int)");
  }
  for (; wVar2 <= y2; wVar2 = wVar2 + L'\x01') {
    lVar1 = (loc)loc(x1_00,wVar2);
    square_set_feat((chunk_conflict *)c,lVar1,feat);
  }
  generate_mark(c,y1,x1_00,y2,x1_00,L'\v');
  for (wVar2 = x1; wVar2 <= x2; wVar2 = wVar2 + L'\x01') {
    lVar1 = (loc)loc(wVar2,y1_00);
    square_set_feat((chunk_conflict *)c,lVar1,feat);
  }
  generate_mark(c,y1_00,x1,y1_00,x2,L'\v');
  return;
}

Assistant:

static void generate_plus(struct chunk *c, int y1, int x1, int y2, int x2, 
						  int feat, int flag)
{
	int y, x;

	/* Find the center */
	int y0 = (y1 + y2) / 2;
	int x0 = (x1 + x2) / 2;

	assert(c);

	for (y = y1; y <= y2; y++) square_set_feat(c, loc(x0, y), feat);
	if (flag) generate_mark(c, y1, x0, y2, x0, flag);
	for (x = x1; x <= x2; x++) square_set_feat(c, loc(x, y0), feat);
	if (flag) generate_mark(c, y0, x1, y0, x2, flag);
}